

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O0

OneofGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetOneofGeneratorInfo
          (Context *this,OneofDescriptor *oneof)

{
  LogMessage *pLVar1;
  string *value;
  LogFinisher local_65 [13];
  LogMessage local_58;
  second_type *local_20;
  OneofGeneratorInfo *result;
  OneofDescriptor *oneof_local;
  Context *this_local;
  
  result = (OneofGeneratorInfo *)oneof;
  oneof_local = (OneofDescriptor *)this;
  local_20 = FindOrNull<std::map<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>>
                       (&this->oneof_generator_info_map_,(first_type *)&result);
  if (local_20 == (second_type *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
               ,0xba);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,"Can not find OneofGeneratorInfo for oneof: ");
    value = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)result);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,value);
    internal::LogFinisher::operator=(local_65,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return local_20;
}

Assistant:

const OneofGeneratorInfo* Context::GetOneofGeneratorInfo(
    const OneofDescriptor* oneof) const {
  const OneofGeneratorInfo* result =
      FindOrNull(oneof_generator_info_map_, oneof);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find OneofGeneratorInfo for oneof: "
               << oneof->name();
  }
  return result;
}